

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

controller * __thiscall
boost::ext::di::v1_3_0::providers::stack_over_heap::
get<controller,boost::ext::di::v1_3_0::core::successful::any_type_ref<controller,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>,boost::ext::di::v1_3_0::core::successful::any_type_ref<controller,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
          (stack_over_heap *this,direct *param_1,heap *param_2,
          any_type_ref<controller,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
          *args,any_type_ref<controller,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
                *args_1)

{
  controller *this_00;
  model *pmVar1;
  view *pvVar2;
  any_type_ref<controller,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
  *args_local_1;
  any_type_ref<controller,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
  *args_local;
  heap *param_2_local;
  direct *param_1_local;
  stack_over_heap *this_local;
  
  this_00 = (controller *)operator_new(1);
  pmVar1 = core::successful::any_type_ref::operator_cast_to_model_((any_type_ref *)args);
  pvVar2 = core::successful::any_type_ref::operator_cast_to_view_((any_type_ref *)args_1);
  controller::controller(this_00,pmVar1,pvVar2);
  return this_00;
}

Assistant:

auto get(const type_traits::direct&, const type_traits::heap&, TArgs&&... args) const {
    return new T(static_cast<TArgs&&>(args)...);
  }